

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O0

GLuint gl4cts::SparseBufferTestUtilities::createProgram
                 (Functions *gl,char **fs_body_parts,uint n_fs_body_parts,char **vs_body_parts,
                 uint n_vs_body_parts,char **attribute_names,uint *attribute_locations,
                 uint n_attribute_properties,GLchar **tf_varyings,uint n_tf_varyings,
                 GLenum tf_varying_mode)

{
  deUint32 dVar1;
  uint local_46c;
  undefined1 local_468 [4];
  uint n_attribute;
  char temp [1024];
  uint local_60;
  uint n_so_id;
  uint n_so_ids;
  GLuint so_ids [2];
  GLuint vs_id;
  int iStack_44;
  bool result;
  GLuint po_id;
  GLint link_status;
  GLuint fs_id;
  GLint compile_status;
  char **attribute_names_local;
  char **ppcStack_28;
  uint n_vs_body_parts_local;
  char **vs_body_parts_local;
  char **ppcStack_18;
  uint n_fs_body_parts_local;
  char **fs_body_parts_local;
  Functions *gl_local;
  
  link_status = 0;
  po_id = 0;
  iStack_44 = 0;
  so_ids[1]._3_1_ = 1;
  so_ids[0] = 0;
  _fs_id = attribute_names;
  attribute_names_local._4_4_ = n_vs_body_parts;
  ppcStack_28 = vs_body_parts;
  vs_body_parts_local._4_4_ = n_fs_body_parts;
  ppcStack_18 = fs_body_parts;
  fs_body_parts_local = (char **)gl;
  if (n_fs_body_parts != 0) {
    po_id = (*gl->createShader)(0x8b30);
  }
  vs_id = (*(code *)fs_body_parts_local[0x79])();
  if (attribute_names_local._4_4_ != 0) {
    so_ids[0] = (*(code *)fs_body_parts_local[0x7e])(0x8b31);
  }
  dVar1 = (*(code *)fs_body_parts_local[0x100])();
  glu::checkError(dVar1,"glCreateProgram() / glCreateShader() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xd8);
  if (vs_body_parts_local._4_4_ != 0) {
    (*(code *)fs_body_parts_local[2])(vs_id,po_id);
  }
  if (attribute_names_local._4_4_ != 0) {
    (*(code *)fs_body_parts_local[2])(vs_id,so_ids[0]);
  }
  dVar1 = (*(code *)fs_body_parts_local[0x100])();
  glu::checkError(dVar1,"glAttachShader() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xe4);
  if (vs_body_parts_local._4_4_ != 0) {
    (*(code *)fs_body_parts_local[599])(po_id,vs_body_parts_local._4_4_,ppcStack_18,0);
  }
  if (attribute_names_local._4_4_ != 0) {
    (*(code *)fs_body_parts_local[599])(so_ids[0],attribute_names_local._4_4_,ppcStack_28,0);
  }
  dVar1 = (*(code *)fs_body_parts_local[0x100])();
  glu::checkError(dVar1,"glShaderSource() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xf0);
  n_so_id = po_id;
  n_so_ids = so_ids[0];
  local_60 = 0;
  do {
    if (1 < local_60) {
      for (local_46c = 0; local_46c < n_attribute_properties; local_46c = local_46c + 1) {
        (*(code *)fs_body_parts_local[7])(vs_id,attribute_locations[local_46c],_fs_id[local_46c]);
        dVar1 = (*(code *)fs_body_parts_local[0x100])();
        glu::checkError(dVar1,"glBindAttribLocation() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                        ,0x111);
      }
      if (n_tf_varyings != 0) {
        (*(code *)fs_body_parts_local[0x299])(vs_id,n_tf_varyings,tf_varyings,tf_varying_mode);
        dVar1 = (*(code *)fs_body_parts_local[0x100])();
        glu::checkError(dVar1,"glTransformFeedbackVaryings() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                        ,0x118);
      }
      (*(code *)fs_body_parts_local[0x19d])(vs_id);
      dVar1 = (*(code *)fs_body_parts_local[0x100])();
      glu::checkError(dVar1,"glLinkProgram() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x11d);
      (*(code *)fs_body_parts_local[0x13b])(vs_id,0x8b82,&stack0xffffffffffffffbc);
      dVar1 = (*(code *)fs_body_parts_local[0x100])();
      glu::checkError(dVar1,"glGetProgramiv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x121);
      if (iStack_44 != 1) {
        so_ids[1]._3_1_ = 0;
      }
LAB_01160378:
      if (po_id != 0) {
        (*(code *)fs_body_parts_local[0x8e])(po_id);
        po_id = 0;
      }
      if (so_ids[0] != 0) {
        (*(code *)fs_body_parts_local[0x8e])(so_ids[0]);
        so_ids[0] = 0;
      }
      if (((so_ids[1]._3_1_ & 1) == 0) && (vs_id != 0)) {
        (*(code *)fs_body_parts_local[0x89])(vs_id);
        vs_id = 0;
      }
      return vs_id;
    }
    if ((&n_so_id)[local_60] != 0) {
      (*(code *)fs_body_parts_local[0x49])((&n_so_id)[local_60]);
      dVar1 = (*(code *)fs_body_parts_local[0x100])();
      glu::checkError(dVar1,"glCompileShader() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0xfb);
      (*(code *)fs_body_parts_local[0x14e])((&n_so_id)[local_60],0x8b81,&link_status);
      dVar1 = (*(code *)fs_body_parts_local[0x100])();
      glu::checkError(dVar1,"glGetShaderiv() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0xff);
      (*(code *)fs_body_parts_local[0x14b])((&n_so_id)[local_60],0x400,0,local_468);
      if (link_status != 1) {
        so_ids[1]._3_1_ = 0;
        goto LAB_01160378;
      }
    }
    local_60 = local_60 + 1;
  } while( true );
}

Assistant:

glw::GLuint SparseBufferTestUtilities::createProgram(const glw::Functions& gl, const char** fs_body_parts,
													 unsigned int n_fs_body_parts, const char** vs_body_parts,
													 unsigned int n_vs_body_parts, const char** attribute_names,
													 const unsigned int*	   attribute_locations,
													 unsigned int			   n_attribute_properties,
													 const glw::GLchar* const* tf_varyings, unsigned int n_tf_varyings,
													 glw::GLenum tf_varying_mode)
{
	glw::GLint  compile_status = GL_FALSE;
	glw::GLuint fs_id		   = 0;
	glw::GLint  link_status	= GL_FALSE;
	glw::GLuint po_id		   = 0;
	bool		result		   = true;
	glw::GLuint vs_id		   = 0;

	if (n_fs_body_parts > 0)
	{
		fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	}

	po_id = gl.createProgram();

	if (n_vs_body_parts > 0)
	{
		vs_id = gl.createShader(GL_VERTEX_SHADER);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() / glCreateShader() call(s) failed.");

	if (n_fs_body_parts > 0)
	{
		gl.attachShader(po_id, fs_id);
	}

	if (n_vs_body_parts > 0)
	{
		gl.attachShader(po_id, vs_id);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call(s) failed.");

	if (n_fs_body_parts > 0)
	{
		gl.shaderSource(fs_id, n_fs_body_parts, fs_body_parts, NULL); /* length */
	}

	if (n_vs_body_parts > 0)
	{
		gl.shaderSource(vs_id, n_vs_body_parts, vs_body_parts, NULL); /* length */
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call(s) failed.");

	const glw::GLuint  so_ids[] = { fs_id, vs_id };
	const unsigned int n_so_ids = sizeof(so_ids) / sizeof(so_ids[0]);

	for (unsigned int n_so_id = 0; n_so_id < n_so_ids; ++n_so_id)
	{
		if (so_ids[n_so_id] != 0)
		{
			gl.compileShader(so_ids[n_so_id]);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

			gl.getShaderiv(so_ids[n_so_id], GL_COMPILE_STATUS, &compile_status);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed");

			char temp[1024];
			gl.getShaderInfoLog(so_ids[n_so_id], 1024, NULL, temp);

			if (GL_TRUE != compile_status)
			{
				result = false;

				goto end;
			}
		} /* if (so_ids[n_so_id] != 0) */
	}	 /* for (all shader object IDs) */

	for (unsigned int n_attribute = 0; n_attribute < n_attribute_properties; ++n_attribute)
	{
		gl.bindAttribLocation(po_id, attribute_locations[n_attribute], attribute_names[n_attribute]);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindAttribLocation() call failed.");
	} /* for (all attributes to configure) */

	if (n_tf_varyings != 0)
	{
		gl.transformFeedbackVaryings(po_id, n_tf_varyings, tf_varyings, tf_varying_mode);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() call failed.");
	} /* if (n_tf_varyings != 0) */

	gl.linkProgram(po_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed.");

	gl.getProgramiv(po_id, GL_LINK_STATUS, &link_status);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

	if (GL_TRUE != link_status)
	{
		result = false;

		goto end;
	}

end:
	if (fs_id != 0)
	{
		gl.deleteShader(fs_id);

		fs_id = 0;
	}

	if (vs_id != 0)
	{
		gl.deleteShader(vs_id);

		vs_id = 0;
	}

	if (!result)
	{

		if (po_id != 0)
		{
			gl.deleteProgram(po_id);

			po_id = 0;
		}
	} /* if (!result) */

	return po_id;
}